

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O2

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation<long>
          (ConstantExpression *this,ConstantExpression *result,long *lhs,long *rhs,Operator op)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  String *__rhs;
  long lVar1;
  Error error;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Error local_48;
  
  switch(op) {
  case ADD:
    lVar1 = *rhs + *lhs;
    break;
  case SUB:
    lVar1 = *lhs - *rhs;
    break;
  case MUL:
    lVar1 = *rhs * *lhs;
    break;
  case DIV:
    lVar1 = *rhs;
    if ((lVar1 != 0) || (this->mErrorHandler == (ErrorHandler *)0x0)) {
      UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[7];
      (*UNRECOVERED_JUMPTABLE)(result,*lhs / lVar1,*lhs % lVar1,UNRECOVERED_JUMPTABLE);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"division by zero",&local_69);
    Error::Error(&local_48,ERR_INVALIDPARAMS,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_48);
    (*(result->super_INode)._vptr_INode[6])(0,result);
    goto LAB_00854f6f;
  default:
    if (this->mErrorHandler == (ErrorHandler *)0x0) {
      return;
    }
    __rhs = ArithmeticExpression::operatorString_abi_cxx11_(op);
    std::operator+(&local_68,"invalid operator: ",__rhs);
    Error::Error(&local_48,ERR_INVALIDPARAMS,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_48);
    (*(result->super_INode)._vptr_INode[6])(0,result);
LAB_00854f6f:
    Error::~Error(&local_48);
    return;
  }
  (*(result->super_INode)._vptr_INode[7])(result,lVar1);
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const T& lhs, const T& rhs, ArithmeticExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::ArithmeticExpression::ADD:
                result.setValue( lhs + rhs );
                return ;

            case AST::ArithmeticExpression::SUB:
                result.setValue( lhs - rhs );
                break;

            case AST::ArithmeticExpression::MUL:
                result.setValue( lhs * rhs );
                break;

            case AST::ArithmeticExpression::DIV:

                if ( rhs == 0 )
                {
                    if ( mErrorHandler )
                    {
                        Error error( Error::ERR_INVALIDPARAMS, "division by zero" );
                        mErrorHandler->handleError( &error );
                        result.setValue( 0. );
                        return;
                    }
                }

                result.setValue( lhs / rhs );
                break;

            default:
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "invalid operator: " + ArithmeticExpression::operatorString( op ) );
                    mErrorHandler->handleError( &error );
                    result.setValue( 0. );
                    return;
                }
            }
        }